

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QUrlModel::WatchItem>::moveAppend
          (QGenericArrayOps<QUrlModel::WatchItem> *this,WatchItem *b,WatchItem *e)

{
  qsizetype *pqVar1;
  WatchItem *pWVar2;
  
  if (b != e) {
    pWVar2 = (this->super_QArrayDataPointer<QUrlModel::WatchItem>).ptr;
    for (; b < e; b = b + 1) {
      QUrlModel::WatchItem::WatchItem
                (pWVar2 + (this->super_QArrayDataPointer<QUrlModel::WatchItem>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<QUrlModel::WatchItem>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }